

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

size_t qHash(QCborValue *value,size_t seed)

{
  Type TVar1;
  size_t sVar2;
  QCborTag QVar3;
  result_type seed_00;
  uchar key;
  long in_FS_OFFSET;
  QHashCombine hash;
  Data local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QUuid local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = value->t;
  if ((1 < (uint)(TVar1 + ~True)) && (TVar1 != Invalid)) {
    if (TVar1 == Uuid) {
      local_58.d = (QDateTimePrivate *)0x0;
      uStack_50 = 0;
      local_38 = QCborValue::toUuid((QCborValue *)value,(QUuid *)&local_58.data);
      seed = qHash(&local_38,seed);
    }
    else if (TVar1 == ByteArray) {
      local_58.d = (QDateTimePrivate *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      QCborValue::toByteArray
                ((QByteArray *)&local_38,(QCborValue *)value,(QByteArray *)&local_58.data);
      seed = qHash((QArrayDataPointer<char> *)&local_38,seed);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58.data);
    }
    else if (TVar1 == String) {
      local_58.d = (QDateTimePrivate *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      QCborValue::toString((QString *)&local_38,(QCborValue *)value,(QString *)&local_58.data);
      seed = qHash((QString *)&local_38,seed);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58.data)
      ;
    }
    else if (TVar1 == Array) {
      QCborValue::toArray((QCborValue *)&local_38);
      seed = qHash((QCborArray *)&local_38,seed);
      QCborArray::~QCborArray((QCborArray *)&local_38);
    }
    else if (TVar1 == Map) {
      QCborValue::toMap((QCborValue *)&local_38);
      seed = qHash((QCborMap *)&local_38,seed);
      QCborMap::~QCborMap((QCborMap *)&local_38);
    }
    else if (TVar1 == Tag) {
      hash = (QHashCombine)0xaa;
      QVar3 = QCborValue::tag((QCborValue *)value,0xffffffffffffffff);
      local_38.data1 = (int)QVar3;
      local_38.data2 = (short)(QVar3 >> 0x20);
      local_38.data3 = (short)(QVar3 >> 0x30);
      seed_00 = QtPrivate::QHashCombine::operator()(&hash,seed,(QCborTag *)&local_38);
      local_58.d = (QDateTimePrivate *)0x0;
      uStack_50 = 0;
      local_48 = CONCAT44(local_48._4_4_,0x117);
      QCborValue::taggedValue
                ((QCborValue *)&local_38,(QCborValue *)value,(QCborValue *)&local_58.data);
      seed = QtPrivate::QHashCombine::operator()(&hash,seed_00,(QCborValue *)&local_38);
      QCborValue::~QCborValue((QCborValue *)&local_38);
      QCborValue::~QCborValue((QCborValue *)&local_58.data);
    }
    else if (TVar1 != False) {
      if (TVar1 == True) {
        seed = seed ^ 0x4179b061e0c0e0d0;
      }
      else {
        if (TVar1 == Double) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            sVar2 = qHash((double)value->n,seed);
            return sVar2;
          }
          goto LAB_002b84c4;
        }
        if (TVar1 == DateTime) {
          QDateTime::QDateTime((QDateTime *)&local_58.data);
          QCborValue::toDateTime((QCborValue *)&local_38,(QDateTime *)value);
          seed = qHash((QDateTime *)&local_38,seed);
          QDateTime::~QDateTime((QDateTime *)&local_38);
          QDateTime::~QDateTime((QDateTime *)&local_58.data);
        }
        else if (TVar1 == Url) {
          QUrl::QUrl((QUrl *)&local_58.data);
          QCborValue::toUrl((QCborValue *)&local_38,(QUrl *)value);
          seed = qHash((QUrl *)&local_38,seed);
          QUrl::~QUrl((QUrl *)&local_38);
          QUrl::~QUrl((QUrl *)&local_58.data);
        }
        else {
          if (TVar1 != RegularExpression) {
            if (TVar1 == Integer) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                sVar2 = QHashPrivate::hash(value->n,seed);
                return sVar2;
              }
            }
            else {
              key = '\x17';
              if ((TVar1 & 0xffffff00) == SimpleType) {
                key = (uchar)TVar1;
              }
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                sVar2 = qHash(key,seed);
                return sVar2;
              }
            }
            goto LAB_002b84c4;
          }
          QRegularExpression::QRegularExpression((QRegularExpression *)&local_58.data);
          QCborValue::toRegularExpression((QCborValue *)&local_38,(QRegularExpression *)value);
          seed = qHash((QRegularExpression *)&local_38,seed);
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_38);
          QRegularExpression::~QRegularExpression((QRegularExpression *)&local_58.data);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return seed;
  }
LAB_002b84c4:
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QCborValue &value, size_t seed)
{
    switch (value.type()) {
    case QCborValue::Integer:
        return qHash(value.toInteger(), seed);
    case QCborValue::ByteArray:
        return qHash(value.toByteArray(), seed);
    case QCborValue::String:
        return qHash(value.toString(), seed);
    case QCborValue::Array:
        return qHash(value.toArray(), seed);
    case QCborValue::Map:
        return qHash(value.toMap(), seed);
    case QCborValue::Tag: {
        QtPrivate::QHashCombine hash;
        seed = hash(seed, value.tag());
        seed = hash(seed, value.taggedValue());
        return seed;
    }
    case QCborValue::SimpleType:
        break;
    case QCborValue::False:
        return qHash(false, seed);
    case QCborValue::True:
        return qHash(true, seed);
    case QCborValue::Null:
        return qHash(nullptr, seed);
    case QCborValue::Undefined:
        return seed;
    case QCborValue::Double:
        return qHash(value.toDouble(), seed);
#if QT_CONFIG(datestring)
    case QCborValue::DateTime:
        return qHash(value.toDateTime(), seed);
#endif
#ifndef QT_BOOTSTRAPPED
    case QCborValue::Url:
        return qHash(value.toUrl(), seed);
#  if QT_CONFIG(regularexpression)
    case QCborValue::RegularExpression:
        return qHash(value.toRegularExpression(), seed);
#  endif
    case QCborValue::Uuid:
        return qHash(value.toUuid(), seed);
#endif
    case QCborValue::Invalid:
        return seed;
    default:
        break;
    }

    Q_ASSERT(value.isSimpleType());
    return qHash(value.toSimpleType(), seed);
}